

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QStringView,_QXmlStreamReaderPrivate::Entity> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
findNode<QStringView>
          (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *this,
          QStringView *key)

{
  byte bVar1;
  size_t hash;
  Node<QStringView,_QXmlStreamReaderPrivate::Entity> *pNVar2;
  Bucket BVar3;
  
  hash = ::qHash(*key,this->seed);
  BVar3 = findBucketWithHash<QStringView>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *)0x0;
  }
  else {
    pNVar2 = (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *)
             (((BVar3.span)->entries->storage).data + (uint)bVar1 * 0x48);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }